

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O2

void __thiscall Centaurus::Grammar<unsigned_char>::optimize(Grammar<unsigned_char> *this)

{
  __node_base *p_Var1;
  
  p_Var1 = &(this->m_networks)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    ATNMachine<unsigned_char>::drop_passthrough_nodes((ATNMachine<unsigned_char> *)(p_Var1 + 6));
  }
  return;
}

Assistant:

virtual void optimize() override
    {
        for (auto& p : m_networks)
        {
            p.second.drop_passthrough_nodes();
        }
    }